

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlEnumerationPtr xmlParseNotationType(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  xmlParserInputPtr pxVar2;
  int iVar3;
  xmlChar *pxVar4;
  xmlEnumerationPtr pxVar5;
  xmlEnumerationPtr pxVar6;
  xmlEnumerationPtr cur;
  xmlEnumerationPtr pxVar7;
  
  pxVar2 = ctxt->input;
  pxVar4 = pxVar2->cur;
  if (*pxVar4 == '(') {
    if (((ctxt->progressive == 0) && (500 < (long)pxVar4 - (long)pxVar2->base)) &&
       ((long)pxVar2->end - (long)pxVar4 < 500)) {
      xmlSHRINK(ctxt);
    }
    pxVar6 = (xmlEnumerationPtr)0x0;
    cur = (xmlEnumerationPtr)0x0;
    do {
      xmlNextChar(ctxt);
      xmlSkipBlankChars(ctxt);
      pxVar4 = xmlParseName(ctxt);
      pxVar5 = cur;
      if (pxVar4 == (xmlChar *)0x0) {
        xmlFatalErrMsg(ctxt,XML_ERR_NAME_REQUIRED,"Name expected in NOTATION declaration\n");
        goto LAB_0015d580;
      }
      for (; pxVar7 = cur, pxVar5 != (xmlEnumerationPtr)0x0; pxVar5 = pxVar5->next) {
        iVar3 = xmlStrEqual(pxVar4,pxVar5->name);
        if (iVar3 != 0) {
          xmlValidityError(ctxt,XML_DTD_DUP_TOKEN,
                           "standalone: attribute notation value token %s duplicated\n",pxVar4,
                           (xmlChar *)0x0);
          iVar3 = xmlDictOwns(ctxt->dict,pxVar4);
          pxVar5 = pxVar6;
          if (iVar3 == 0) {
            (*xmlFree)(pxVar4);
          }
          goto LAB_0015d51f;
        }
      }
      pxVar5 = xmlCreateEnumeration(pxVar4);
      if (pxVar5 == (xmlEnumerationPtr)0x0) goto LAB_0015d580;
      pxVar7 = pxVar5;
      if (pxVar6 != (xmlEnumerationPtr)0x0) {
        pxVar6->next = pxVar5;
        pxVar7 = cur;
      }
LAB_0015d51f:
      xmlSkipBlankChars(ctxt);
      xVar1 = *ctxt->input->cur;
      pxVar6 = pxVar5;
      cur = pxVar7;
    } while (xVar1 == '|');
    if (xVar1 == ')') {
      xmlNextChar(ctxt);
    }
    else {
      xmlFatalErr(ctxt,XML_ERR_NOTATION_NOT_FINISHED,(char *)0x0);
LAB_0015d580:
      xmlFreeEnumeration(cur);
      pxVar7 = (xmlEnumerationPtr)0x0;
    }
  }
  else {
    pxVar7 = (xmlEnumerationPtr)0x0;
    xmlFatalErr(ctxt,XML_ERR_NOTATION_NOT_STARTED,(char *)0x0);
  }
  return pxVar7;
}

Assistant:

xmlEnumerationPtr
xmlParseNotationType(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    xmlEnumerationPtr ret = NULL, last = NULL, cur, tmp;

    if (RAW != '(') {
	xmlFatalErr(ctxt, XML_ERR_NOTATION_NOT_STARTED, NULL);
	return(NULL);
    }
    SHRINK;
    do {
        NEXT;
	SKIP_BLANKS;
        name = xmlParseName(ctxt);
	if (name == NULL) {
	    xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
			   "Name expected in NOTATION declaration\n");
            xmlFreeEnumeration(ret);
	    return(NULL);
	}
	tmp = ret;
	while (tmp != NULL) {
	    if (xmlStrEqual(name, tmp->name)) {
		xmlValidityError(ctxt, XML_DTD_DUP_TOKEN,
	  "standalone: attribute notation value token %s duplicated\n",
				 name, NULL);
		if (!xmlDictOwns(ctxt->dict, name))
		    xmlFree((xmlChar *) name);
		break;
	    }
	    tmp = tmp->next;
	}
	if (tmp == NULL) {
	    cur = xmlCreateEnumeration(name);
	    if (cur == NULL) {
                xmlFreeEnumeration(ret);
                return(NULL);
            }
	    if (last == NULL) ret = last = cur;
	    else {
		last->next = cur;
		last = cur;
	    }
	}
	SKIP_BLANKS;
    } while (RAW == '|');
    if (RAW != ')') {
	xmlFatalErr(ctxt, XML_ERR_NOTATION_NOT_FINISHED, NULL);
        xmlFreeEnumeration(ret);
	return(NULL);
    }
    NEXT;
    return(ret);
}